

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AC3DImporter::LoadObjectSection
          (AC3DImporter *this,
          vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
          *objects)

{
  char **in;
  pointer *pppVar1;
  pointer *ppaVar2;
  float fVar3;
  pointer pOVar4;
  vector<aiLight*,std::allocator<aiLight*>> *this_00;
  iterator __position;
  pointer pSVar5;
  iterator __position_00;
  pointer ppVar6;
  iterator __position_01;
  pointer paVar7;
  void *pvVar8;
  aiVector2D *paVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ai_uint32 aVar13;
  aiLight *paVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  byte *pbVar18;
  long lVar19;
  Logger *pLVar20;
  runtime_error *prVar21;
  Type TVar22;
  uint uVar23;
  byte bVar24;
  char cVar25;
  byte *pbVar26;
  uint i_1;
  uint uVar27;
  uint i_3;
  uint uVar28;
  bool bVar29;
  uint i;
  char *pcVar30;
  byte *pbVar31;
  aiLight *light;
  aiLight *local_180;
  int local_174;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_170;
  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_> *local_168;
  string *local_160;
  string *local_158;
  vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
  *local_150;
  undefined1 local_148 [4];
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  pointer local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> local_120;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [5];
  pointer local_a8;
  pointer local_98;
  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_> local_90 [2]
  ;
  aiVector2D *local_60;
  aiVector3D *local_58;
  ulong local_50;
  aiMatrix3x3 *local_48;
  aiVector2D *local_40;
  AC3DImporter *local_38;
  
  pcVar17 = this->buffer;
  iVar12 = strncmp("OBJECT",pcVar17,6);
  if (iVar12 == 0) {
    bVar24 = pcVar17[6];
    if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
      in = &this->buffer;
      pcVar30 = pcVar17 + 7;
      if (bVar24 == 0) {
        pcVar30 = pcVar17 + 6;
      }
      *in = pcVar30;
      for (; (*pcVar30 == ' ' || (*pcVar30 == '\t')); pcVar30 = pcVar30 + 1) {
      }
      this->buffer = pcVar30;
      this->mNumMeshes = this->mNumMeshes + 1;
      Object::Object((Object *)local_148);
      std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
      emplace_back<Assimp::AC3DImporter::Object>(objects,(Object *)local_148);
      std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
      ~vector(local_90);
      if (local_a8 != (pointer)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != local_f8) {
        operator_delete(local_108._M_p,local_f8[0]._M_allocated_capacity + 1);
      }
      std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
      ~vector(&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_13c,fStack_140) != &aStack_130) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_13c,fStack_140),aStack_130._M_allocated_capacity + 1);
      }
      pOVar4 = (objects->
               super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_180 = (aiLight *)0x0;
      pcVar17 = *in;
      if (pcVar17 == (char *)0x0) {
        __assert_fail("__null != s1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                      ,0xbf,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      iVar12 = strncasecmp(pcVar17,"light",5);
      if (iVar12 == 0) {
        this_00 = (vector<aiLight*,std::allocator<aiLight*>> *)this->mLights;
        paVar14 = (aiLight *)operator_new(0x46c);
        (paVar14->mName).length = 0;
        (paVar14->mName).data[0] = '\0';
        memset((paVar14->mName).data + 1,0x1b,0x3ff);
        paVar14->mType = aiLightSource_UNDEFINED;
        (paVar14->mPosition).x = 0.0;
        (paVar14->mPosition).y = 0.0;
        (paVar14->mPosition).z = 0.0;
        (paVar14->mDirection).x = 0.0;
        (paVar14->mDirection).y = 0.0;
        *(undefined8 *)&(paVar14->mDirection).z = 0;
        (paVar14->mUp).x = 0.0;
        (paVar14->mUp).y = 0.0;
        *(undefined8 *)&(paVar14->mUp).z = 0;
        paVar14->mAttenuationLinear = 1.0;
        paVar14->mAttenuationQuadratic = 0.0;
        (paVar14->mColorDiffuse).r = 0.0;
        (paVar14->mColorDiffuse).g = 0.0;
        (paVar14->mColorDiffuse).b = 0.0;
        (paVar14->mColorSpecular).r = 0.0;
        (paVar14->mColorSpecular).g = 0.0;
        *(undefined8 *)&(paVar14->mColorSpecular).b = 0;
        (paVar14->mColorAmbient).g = 0.0;
        (paVar14->mColorAmbient).b = 0.0;
        paVar14->mAngleInnerCone = 6.2831855;
        paVar14->mAngleOuterCone = 6.2831855;
        (paVar14->mSize).x = 0.0;
        (paVar14->mSize).y = 0.0;
        __position._M_current = *(aiLight ***)(this_00 + 8);
        local_180 = paVar14;
        if (__position._M_current == *(aiLight ***)(this_00 + 0x10)) {
          std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                    (this_00,__position,&local_180);
        }
        else {
          *__position._M_current = paVar14;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        local_180->mType = aiLightSource_POINT;
        (local_180->mColorSpecular).g = 1.0;
        (local_180->mColorSpecular).b = 1.0;
        (local_180->mColorDiffuse).r = 1.0;
        (local_180->mColorDiffuse).g = 1.0;
        (local_180->mColorDiffuse).b = 1.0;
        (local_180->mColorSpecular).r = 1.0;
        local_180->mAttenuationConstant = 1.0;
        aVar13 = snprintf((local_180->mName).data,0x400,"ACLight_%i",
                          (ulong)((int)((ulong)((long)(this->mLights->
                                                                                                            
                                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->mLights->
                                                                                                          
                                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                                 - 1));
        paVar14 = local_180;
        (local_180->mName).length = aVar13;
        pcVar17 = (local_180->mName).data;
        _local_148 = &local_138;
        sVar15 = strlen(pcVar17);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,pcVar17,(paVar14->mName).data + sVar15);
        std::__cxx11::string::operator=((string *)&pOVar4[-1].name,(string *)local_148);
        if (_local_148 != &local_138) {
          operator_delete(_local_148,(ulong)((long)&local_138->first + 1));
        }
        pLVar20 = DefaultLogger::get();
        Logger::debug(pLVar20,"AC3D: Light source encountered");
        TVar22 = Light;
      }
      else {
        iVar12 = strncasecmp(pcVar17,"group",5);
        if (iVar12 == 0) {
          TVar22 = Group;
        }
        else {
          iVar12 = strncasecmp(pcVar17,"world",5);
          TVar22 = (Type)(iVar12 != 0);
        }
      }
      pOVar4[-1].type = TVar22;
      bVar10 = GetNextLine(this);
      if (bVar10) {
        local_160 = (string *)&pOVar4[-1].name;
        local_158 = (string *)&pOVar4[-1].texture;
        local_60 = &pOVar4[-1].texRepeat;
        local_40 = &pOVar4[-1].texOffset;
        local_48 = &pOVar4[-1].rotation;
        local_58 = &pOVar4[-1].translation;
        local_170 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                    &pOVar4[-1].vertices;
        local_168 = &pOVar4[-1].surfaces;
        local_38 = this;
        do {
          pbVar18 = (byte *)*in;
          iVar12 = strncmp("kids",(char *)pbVar18,4);
          if (iVar12 == 0) {
            bVar24 = pbVar18[4];
            if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
              pbVar18 = pbVar18 + (5 - (ulong)(bVar24 == 0));
              *in = (char *)pbVar18;
              for (; (*pbVar18 == 0x20 || (*pbVar18 == 9)); pbVar18 = pbVar18 + 1) {
              }
              *in = (char *)pbVar18;
              bVar24 = *pbVar18;
              if ((byte)(bVar24 - 0x3a) < 0xf6) {
                GetNextLine(this);
                return;
              }
              uVar27 = 0;
              do {
                uVar27 = (uint)(byte)(bVar24 - 0x30) + uVar27 * 10;
                bVar24 = pbVar18[1];
                pbVar18 = pbVar18 + 1;
              } while (0xf5 < (byte)(bVar24 - 0x3a));
              this->buffer = (char *)pbVar18;
              GetNextLine(this);
              if (uVar27 == 0) {
                return;
              }
              std::
              vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
              reserve(&pOVar4[-1].children,(ulong)uVar27);
              uVar28 = 0;
              do {
                LoadObjectSection(this,&pOVar4[-1].children);
                uVar28 = uVar28 + 1;
              } while (uVar28 < uVar27);
              return;
            }
          }
          iVar12 = strncmp("name",(char *)pbVar18,4);
          if (iVar12 == 0) {
            bVar24 = pbVar18[4];
            if ((0x20 < (ulong)bVar24) || ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) == 0))
            goto LAB_003f3407;
            pbVar31 = pbVar18 + 5;
            if (bVar24 == 0) {
              pbVar31 = pbVar18 + 4;
            }
            *in = (char *)pbVar31;
            uVar27 = ~(uint)pbVar31;
            while( true ) {
              pbVar18 = pbVar31 + 1;
              if ((*pbVar31 != 0x20) && (*pbVar31 != 9)) break;
              uVar27 = uVar27 - 1;
              pbVar31 = pbVar18;
            }
            *in = (char *)pbVar31;
            pbVar26 = pbVar18;
            if (*pbVar31 == 0) {
              prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
              _local_148 = &local_138;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_148,"AC3D: Unexpected EOF in string","");
              std::runtime_error::runtime_error(prVar21,(string *)local_148);
              *(undefined ***)prVar21 = &PTR__runtime_error_0080bf48;
              __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
LAB_003f34f0:
            *in = (char *)pbVar26;
            uVar16 = (ulong)*pbVar26;
            if (0x22 < uVar16) {
LAB_003f3508:
              pbVar26 = pbVar26 + 1;
              goto LAB_003f34f0;
            }
            if ((0x3401UL >> (uVar16 & 0x3f) & 1) == 0) {
              if (uVar16 == 0x22) goto LAB_003f355f;
              goto LAB_003f3508;
            }
            pLVar20 = DefaultLogger::get();
            Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL in string");
            std::__cxx11::string::_M_replace
                      ((ulong)local_160,0,(char *)pOVar4[-1].name._M_string_length,0x6bfef8);
            pbVar26 = (byte *)*in;
            if ((*pbVar26 < 0xe) && ((0x3401U >> (*pbVar26 & 0x1f) & 1) != 0)) goto LAB_003f3b13;
LAB_003f355f:
            _local_148 = &local_138;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_148,pbVar18,pbVar18 + ((int)pbVar26 + uVar27));
            std::__cxx11::string::operator=(local_160,(string *)local_148);
            if (_local_148 != &local_138) {
              operator_delete(_local_148,(ulong)((long)&local_138->first + 1));
            }
            paVar14 = local_180;
            *in = *in + 1;
            if ((local_180 != (aiLight *)0x0) &&
               (uVar16 = pOVar4[-1].name._M_string_length, uVar16 < 0x400)) {
              (local_180->mName).length = (ai_uint32)uVar16;
              memcpy((local_180->mName).data,*(void **)local_160,uVar16);
              (paVar14->mName).data[uVar16] = '\0';
            }
          }
          else {
LAB_003f3407:
            iVar12 = strncmp("texture",(char *)pbVar18,7);
            if (iVar12 == 0) {
              bVar24 = pbVar18[7];
              if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                pbVar31 = pbVar18 + 8;
                if (bVar24 == 0) {
                  pbVar31 = pbVar18 + 7;
                }
                *in = (char *)pbVar31;
                uVar27 = ~(uint)pbVar31;
                while( true ) {
                  pbVar18 = pbVar31 + 1;
                  if ((*pbVar31 != 0x20) && (*pbVar31 != 9)) break;
                  uVar27 = uVar27 - 1;
                  pbVar31 = pbVar18;
                }
                *in = (char *)pbVar31;
                pbVar26 = pbVar18;
                if (*pbVar31 == 0) {
                  prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                  _local_148 = &local_138;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_148,"AC3D: Unexpected EOF in string","");
                  std::runtime_error::runtime_error(prVar21,(string *)local_148);
                  *(undefined ***)prVar21 = &PTR__runtime_error_0080bf48;
                  __cxa_throw(prVar21,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
LAB_003f3657:
                *in = (char *)pbVar26;
                uVar16 = (ulong)*pbVar26;
                if (0x22 < uVar16) {
LAB_003f366f:
                  pbVar26 = pbVar26 + 1;
                  goto LAB_003f3657;
                }
                if ((0x3401UL >> (uVar16 & 0x3f) & 1) == 0) {
                  if (uVar16 == 0x22) goto LAB_003f36c6;
                  goto LAB_003f366f;
                }
                pLVar20 = DefaultLogger::get();
                Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL in string");
                std::__cxx11::string::_M_replace
                          ((ulong)local_158,0,(char *)pOVar4[-1].texture._M_string_length,0x6bfef8);
                pbVar26 = (byte *)*in;
                if ((*pbVar26 < 0xe) && ((0x3401U >> (*pbVar26 & 0x1f) & 1) != 0))
                goto LAB_003f3b13;
LAB_003f36c6:
                _local_148 = &local_138;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_148,pbVar18,pbVar18 + ((int)pbVar26 + uVar27));
                std::__cxx11::string::operator=(local_158,(string *)local_148);
                if (_local_148 != &local_138) {
                  operator_delete(_local_148,(ulong)((long)&local_138->first + 1));
                }
                *in = *in + 1;
                goto LAB_003f3b13;
              }
            }
            iVar12 = strncmp("texrep",(char *)pbVar18,6);
            paVar9 = local_60;
            if (iVar12 == 0) {
              bVar24 = pbVar18[6];
              if ((0x20 < (ulong)bVar24) || ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) == 0))
              goto LAB_003f343f;
              pbVar31 = pbVar18 + 7;
              if (bVar24 == 0) {
                pbVar31 = pbVar18 + 6;
              }
              *in = (char *)pbVar31;
              for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
              }
              *in = (char *)pbVar31;
              for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
              }
              *in = (char *)pbVar31;
              if ((0xd < *pbVar31) || ((0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                lVar19 = 0;
                bVar10 = true;
                do {
                  bVar11 = bVar10;
                  for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                      pbVar18 = pbVar18 + 1) {
                  }
                  *in = (char *)pbVar18;
                  if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                    pLVar20 = DefaultLogger::get();
                    Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                  }
                  else {
                    pcVar17 = fast_atoreal_move<float>((char *)pbVar18,&paVar9->x + lVar19,true);
                    *in = pcVar17;
                  }
                  lVar19 = 1;
                  bVar10 = false;
                } while (bVar11);
                fVar3 = pOVar4[-1].texRepeat.x;
                if (((fVar3 == 0.0) && (!NAN(fVar3))) ||
                   ((fVar3 = pOVar4[-1].texRepeat.y, fVar3 == 0.0 && (!NAN(fVar3))))) {
                  pOVar4[-1].texRepeat.x = 1.0;
                  pOVar4[-1].texRepeat.y = 1.0;
                }
                goto LAB_003f3b13;
              }
LAB_003f3aff:
              pLVar20 = DefaultLogger::get();
              pcVar17 = "AC3D: Unexpected EOF/EOL";
LAB_003f3b0e:
              Logger::error(pLVar20,pcVar17);
            }
            else {
LAB_003f343f:
              iVar12 = strncmp("texoff",(char *)pbVar18,6);
              if (iVar12 == 0) {
                bVar24 = pbVar18[6];
                if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                  pbVar31 = pbVar18 + 7;
                  if (bVar24 == 0) {
                    pbVar31 = pbVar18 + 6;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  if ((0xd < *pbVar31) || ((0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                    lVar19 = 0;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                          pbVar18 = pbVar18 + 1) {
                      }
                      *in = (char *)pbVar18;
                      if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                        pLVar20 = DefaultLogger::get();
                        Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar17 = fast_atoreal_move<float>
                                            ((char *)pbVar18,&local_40->x + lVar19,true);
                        *in = pcVar17;
                      }
                      lVar19 = 1;
                      bVar10 = false;
                    } while (bVar11);
                    goto LAB_003f3b13;
                  }
                  goto LAB_003f3aff;
                }
              }
              iVar12 = *pbVar18 - 0x72;
              if ((iVar12 == 0) && (iVar12 = pbVar18[1] - 0x6f, iVar12 == 0)) {
                iVar12 = 0x74 - (uint)pbVar18[2];
              }
              else {
                iVar12 = -iVar12;
              }
              if (iVar12 == 0) {
                bVar24 = pbVar18[3];
                if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                  pbVar31 = pbVar18 + 4;
                  if (bVar24 == 0) {
                    pbVar31 = pbVar18 + 3;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  if ((0xd < *pbVar31) || ((0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                    lVar19 = 0;
                    do {
                      for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                          pbVar18 = pbVar18 + 1) {
                      }
                      *in = (char *)pbVar18;
                      if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                        pLVar20 = DefaultLogger::get();
                        Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar17 = fast_atoreal_move<float>
                                            ((char *)pbVar18,&local_48->a1 + lVar19,true);
                        *in = pcVar17;
                      }
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 9);
                    goto LAB_003f3b13;
                  }
                  goto LAB_003f3aff;
                }
              }
              iVar12 = *pbVar18 - 0x6c;
              if ((iVar12 == 0) && (iVar12 = pbVar18[1] - 0x6f, iVar12 == 0)) {
                iVar12 = 99 - (uint)pbVar18[2];
              }
              else {
                iVar12 = -iVar12;
              }
              if (iVar12 == 0) {
                bVar24 = pbVar18[3];
                if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                  pbVar31 = pbVar18 + 4;
                  if (bVar24 == 0) {
                    pbVar31 = pbVar18 + 3;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  if ((0xd < *pbVar31) || ((0x3401U >> (*pbVar31 & 0x1f) & 1) == 0)) {
                    lVar19 = 0;
                    do {
                      for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                          pbVar18 = pbVar18 + 1) {
                      }
                      *in = (char *)pbVar18;
                      if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                        pLVar20 = DefaultLogger::get();
                        Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                      }
                      else {
                        pcVar17 = fast_atoreal_move<float>
                                            ((char *)pbVar18,&local_58->x + lVar19,true);
                        *in = pcVar17;
                      }
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    goto LAB_003f3b13;
                  }
                  goto LAB_003f3aff;
                }
              }
              iVar12 = strncmp("subdiv",(char *)pbVar18,6);
              if (iVar12 == 0) {
                bVar24 = pbVar18[6];
                if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                  pbVar31 = pbVar18 + 7;
                  if (bVar24 == 0) {
                    pbVar31 = pbVar18 + 6;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  bVar24 = *pbVar31;
                  uVar27 = 0;
                  if (0xf5 < (byte)(bVar24 - 0x3a)) {
                    uVar27 = 0;
                    do {
                      uVar27 = (uint)(byte)(bVar24 - 0x30) + uVar27 * 10;
                      bVar24 = pbVar31[1];
                      pbVar31 = pbVar31 + 1;
                    } while (0xf5 < (byte)(bVar24 - 0x3a));
                  }
                  *in = (char *)pbVar31;
                  pOVar4[-1].subDiv = uVar27;
                  goto LAB_003f3b13;
                }
              }
              iVar12 = strncmp("crease",(char *)pbVar18,6);
              if (iVar12 == 0) {
                bVar24 = pbVar18[6];
                if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                  pbVar31 = pbVar18 + 7;
                  if (bVar24 == 0) {
                    pbVar31 = pbVar18 + 6;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  local_148 = (undefined1  [4])0x0;
                  fast_atoreal_move<float>((char *)pbVar31,(float *)local_148,true);
                  pOVar4[-1].crease = (float)local_148;
                  goto LAB_003f3b13;
                }
              }
              iVar12 = strncmp("numvert",(char *)pbVar18,7);
              if (iVar12 == 0) {
                bVar24 = pbVar18[7];
                if (((ulong)bVar24 < 0x21) && ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) != 0)) {
                  pbVar31 = pbVar18 + 8;
                  if (bVar24 == 0) {
                    pbVar31 = pbVar18 + 7;
                  }
                  *in = (char *)pbVar31;
                  for (; (*pbVar31 == 0x20 || (*pbVar31 == 9)); pbVar31 = pbVar31 + 1) {
                  }
                  *in = (char *)pbVar31;
                  bVar24 = *pbVar31;
                  if ((byte)(bVar24 - 0x3a) < 0xf6) {
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_170,0);
                  }
                  else {
                    uVar27 = 0;
                    do {
                      uVar27 = (uint)(byte)(bVar24 - 0x30) + uVar27 * 10;
                      bVar24 = pbVar31[1];
                      pbVar31 = pbVar31 + 1;
                    } while (0xf5 < (byte)(bVar24 - 0x3a));
                    *in = (char *)pbVar31;
                    if (0x1555554 < uVar27) {
                      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_148 = &local_138;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_148,
                                 "AC3D: Too many vertices, would run out of memory","");
                      std::runtime_error::runtime_error(prVar21,(string *)local_148);
                      *(undefined ***)prVar21 = &PTR__runtime_error_0080bf48;
                      __cxa_throw(prVar21,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_170,(ulong)uVar27);
                    if (uVar27 != 0) {
                      uVar28 = 0;
                      do {
                        bVar10 = GetNextLine(this);
                        if (!bVar10) {
                          pLVar20 = DefaultLogger::get();
                          pcVar17 = "AC3D: Unexpected EOF: not all vertices have been parsed yet";
                          goto LAB_003f3b0e;
                        }
                        cVar25 = **in;
                        if (((9 < (byte)(cVar25 - 0x30U)) && (cVar25 != '+')) && (cVar25 != '-')) {
                          pLVar20 = DefaultLogger::get();
                          Logger::error(pLVar20,
                                        "AC3D: Unexpected token: not all vertices have been parsed yet"
                                       );
                          *in = *in + -1;
                          break;
                        }
                        local_148 = (undefined1  [4])0x0;
                        fStack_144 = 0.0;
                        fStack_140 = 0.0;
                        __position_01._M_current =
                             pOVar4[-1].vertices.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if (__position_01._M_current ==
                            pOVar4[-1].vertices.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                          _M_realloc_insert<aiVector3t<float>>
                                    (local_170,__position_01,(aiVector3t<float> *)local_148);
                        }
                        else {
                          (__position_01._M_current)->z = 0.0;
                          (__position_01._M_current)->x = 0.0;
                          (__position_01._M_current)->y = 0.0;
                          ppaVar2 = &pOVar4[-1].vertices.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppaVar2 = *ppaVar2 + 1;
                        }
                        paVar7 = pOVar4[-1].vertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                            pbVar18 = pbVar18 + 1) {
                        }
                        *in = (char *)pbVar18;
                        if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                          pLVar20 = DefaultLogger::get();
                          Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                        }
                        else {
                          lVar19 = 0;
                          do {
                            for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                                pbVar18 = pbVar18 + 1) {
                            }
                            *in = (char *)pbVar18;
                            if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                              pLVar20 = DefaultLogger::get();
                              Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                            }
                            else {
                              pcVar17 = fast_atoreal_move<float>
                                                  ((char *)pbVar18,&paVar7[-1].x + lVar19,true);
                              *in = pcVar17;
                            }
                            lVar19 = lVar19 + 1;
                          } while (lVar19 != 3);
                        }
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar27);
                    }
                  }
                  goto LAB_003f3b13;
                }
              }
              bVar10 = TokenMatch<char_const>(in,"numsurf",7);
              if (bVar10) {
                for (pcVar17 = *in; (*pcVar17 == ' ' || (*pcVar17 == '\t')); pcVar17 = pcVar17 + 1)
                {
                }
                *in = pcVar17;
                cVar25 = *pcVar17;
                if ((byte)(cVar25 - 0x3aU) < 0xf6) {
                  std::
                  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                  ::reserve(local_168,0);
                }
                else {
                  uVar16 = 0;
                  do {
                    uVar27 = (uint)(byte)(cVar25 - 0x30) + (int)uVar16 * 10;
                    uVar16 = (ulong)uVar27;
                    cVar25 = pcVar17[1];
                    pcVar17 = pcVar17 + 1;
                  } while (0xf5 < (byte)(cVar25 - 0x3aU));
                  *in = pcVar17;
                  std::
                  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                  ::reserve(local_168,(ulong)uVar27);
                  if (uVar27 != 0) {
                    iVar12 = 0;
                    bVar10 = false;
                    local_50 = uVar16;
                    do {
                      local_174 = iVar12;
                      GetNextLine(this);
                      pcVar17 = this->buffer;
                      iVar12 = strncmp("SURF",pcVar17,4);
                      if (iVar12 == 0) {
                        bVar24 = pcVar17[4];
                        if ((0x20 < (ulong)bVar24) ||
                           ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) == 0)) goto LAB_003f3dcd;
                        pcVar30 = pcVar17 + 5;
                        if (bVar24 == 0) {
                          pcVar30 = pcVar17 + 4;
                        }
                      }
                      else {
LAB_003f3dcd:
                        if (!bVar10) {
                          pLVar20 = DefaultLogger::get();
                          Logger::warn(pLVar20,"AC3D: SURF token was expected");
                          pLVar20 = DefaultLogger::get();
                          Logger::debug(pLVar20,"Continuing with Quick3D Workaround enabled");
                          pcVar17 = *in;
                        }
                        bVar10 = true;
                        pcVar30 = pcVar17 + -1;
                      }
                      *in = pcVar30;
                      for (; (*pcVar30 == ' ' || (*pcVar30 == '\t')); pcVar30 = pcVar30 + 1) {
                      }
                      *in = pcVar30;
                      local_138 = (pointer)0x0;
                      aStack_130._M_allocated_capacity = 0;
                      local_148 = (undefined1  [4])0x0;
                      fStack_144 = 0.0;
                      fStack_140 = 0.0;
                      uStack_13c = 0;
                      std::
                      vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                      ::emplace_back<Assimp::AC3DImporter::Surface>(local_168,(Surface *)local_148);
                      pvVar8 = (void *)CONCAT44(uStack_13c,fStack_140);
                      if (pvVar8 != (void *)0x0) {
                        operator_delete(pvVar8,aStack_130._M_allocated_capacity - (long)pvVar8);
                      }
                      pSVar5 = pOVar4[-1].surfaces.
                               super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      pcVar17 = *in;
                      cVar25 = *pcVar17;
                      if (cVar25 == '0') {
                        cVar25 = pcVar17[1];
                        if (cVar25 == 'x') {
                          pcVar17 = pcVar17 + 2;
                          uVar27 = 0;
                          do {
                            cVar25 = *pcVar17;
                            if ((byte)(cVar25 - 0x30U) < 10) {
                              uVar27 = uVar27 << 4 | (uint)(byte)(cVar25 - 0x30U);
                            }
                            else {
                              bVar24 = cVar25 + 0xbf;
                              if ((5 < bVar24) && (bVar24 = cVar25 + 0x9f, 5 < bVar24))
                              goto LAB_003f3f32;
                              uVar27 = uVar27 * 0x10 + (uint)bVar24 + 10;
                            }
                            pcVar17 = pcVar17 + 1;
                          } while( true );
                        }
                        if ((byte)(cVar25 - 0x38U) < 0xf8) {
LAB_003f3f11:
                          uVar27 = 0;
                        }
                        else {
                          pcVar17 = pcVar17 + 2;
                          uVar27 = 0;
                          do {
                            uVar27 = (uint)(byte)(cVar25 - 0x30) + uVar27 * 8;
                            cVar25 = *pcVar17;
                            pcVar17 = pcVar17 + 1;
                          } while (0xf7 < (byte)(cVar25 - 0x38U));
                        }
                      }
                      else {
                        if ((byte)(cVar25 - 0x3aU) < 0xf6) goto LAB_003f3f11;
                        uVar27 = 0;
                        do {
                          pcVar17 = pcVar17 + 1;
                          uVar27 = (uint)(byte)(cVar25 - 0x30) + uVar27 * 10;
                          cVar25 = *pcVar17;
                        } while (0xf5 < (byte)(cVar25 - 0x3aU));
                      }
LAB_003f3f32:
                      pSVar5[-1].flags = uVar27;
                      bVar11 = GetNextLine(this);
                      if (!bVar11) {
LAB_003f44d3:
                        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
                        _local_148 = &local_138;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_148,"AC3D: Unexpected EOF: surface is incomplete"
                                   ,"");
                        std::runtime_error::runtime_error(prVar21,(string *)local_148);
                        *(undefined ***)prVar21 = &PTR__runtime_error_0080bf48;
                        __cxa_throw(prVar21,&DeadlyImportError::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_150 = (vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                                   *)&pSVar5[-1].entries;
                      while( true ) {
                        pbVar18 = (byte *)*in;
                        iVar12 = *pbVar18 - 0x6d;
                        if ((iVar12 == 0) && (iVar12 = pbVar18[1] - 0x61, iVar12 == 0)) {
                          iVar12 = 0x74 - (uint)pbVar18[2];
                        }
                        else {
                          iVar12 = -iVar12;
                        }
                        if (iVar12 != 0) break;
                        bVar24 = pbVar18[3];
                        if ((0x20 < (ulong)bVar24) ||
                           ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) == 0)) break;
                        pbVar31 = pbVar18 + 4;
                        if (bVar24 == 0) {
                          pbVar31 = pbVar18 + 3;
                        }
                        *in = (char *)pbVar31;
                        pbVar18 = pbVar31;
                        while( true ) {
                          pbVar18 = pbVar18 + 1;
                          if ((*pbVar31 != 0x20) && (*pbVar31 != 9)) break;
                          pbVar31 = pbVar31 + 1;
                        }
                        *in = (char *)pbVar31;
                        bVar24 = *pbVar31;
                        uVar27 = 0;
                        if (0xf5 < (byte)(bVar24 - 0x3a)) {
                          uVar27 = 0;
                          do {
                            uVar27 = (uint)(byte)(bVar24 - 0x30) + uVar27 * 10;
                            bVar24 = *pbVar18;
                            pbVar18 = pbVar18 + 1;
                          } while (0xf5 < (byte)(bVar24 - 0x3a));
                        }
                        pSVar5[-1].mat = uVar27;
LAB_003f4246:
                        bVar11 = GetNextLine(this);
                        if (!bVar11) goto LAB_003f44d3;
                      }
                      iVar12 = strncmp("refs",(char *)pbVar18,4);
                      if (iVar12 != 0) {
LAB_003f425b:
                        pbVar31 = pbVar18 + -1;
                        goto LAB_003f4264;
                      }
                      bVar24 = pbVar18[4];
                      if ((0x20 < (ulong)bVar24) ||
                         ((0x100003601U >> ((ulong)bVar24 & 0x3f) & 1) == 0)) goto LAB_003f425b;
                      pbVar31 = pbVar18 + 5;
                      if (bVar24 == 0) {
                        pbVar31 = pbVar18 + 4;
                      }
                      *in = (char *)pbVar31;
                      pbVar18 = pbVar31;
                      if ((!bVar10) ||
                         (pSVar5[-1].entries.
                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                          pSVar5[-1].entries.
                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)) {
                        while( true ) {
                          pbVar18 = pbVar18 + 1;
                          if ((*pbVar31 != 0x20) && (*pbVar31 != 9)) break;
                          pbVar31 = pbVar31 + 1;
                        }
                        *in = (char *)pbVar31;
                        bVar24 = *pbVar31;
                        uVar27 = 0;
                        if (0xf5 < (byte)(bVar24 - 0x3a)) {
                          uVar27 = 0;
                          do {
                            uVar27 = (uint)(byte)(bVar24 - 0x30) + uVar27 * 10;
                            bVar24 = *pbVar18;
                            pbVar18 = pbVar18 + 1;
                          } while (0xf5 < (byte)(bVar24 - 0x3a));
                        }
                        std::
                        vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                        ::reserve((vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                   *)local_150,(ulong)uVar27);
                        pOVar4[-1].numRefs = pOVar4[-1].numRefs + uVar27;
                        if (uVar27 != 0) {
                          uVar28 = 0;
                          do {
                            bVar11 = GetNextLine(this);
                            if (!bVar11) {
                              pLVar20 = DefaultLogger::get();
                              Logger::error(pLVar20,
                                            "AC3D: Unexpected EOF: surface references are incomplete"
                                           );
                              break;
                            }
                            local_148 = (undefined1  [4])0x0;
                            fStack_144 = 0.0;
                            fStack_140 = 0.0;
                            __position_00._M_current =
                                 pSVar5[-1].entries.
                                 super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                            if (__position_00._M_current ==
                                pSVar5[-1].entries.
                                super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                              ::_M_realloc_insert<std::pair<unsigned_int,aiVector2t<float>>>
                                        (local_150,__position_00,
                                         (pair<unsigned_int,_aiVector2t<float>_> *)local_148);
                            }
                            else {
                              ((__position_00._M_current)->second).y = 0.0;
                              (__position_00._M_current)->first = 0;
                              ((__position_00._M_current)->second).x = 0.0;
                              pppVar1 = &pSVar5[-1].entries.
                                         super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                              *pppVar1 = *pppVar1 + 1;
                            }
                            ppVar6 = pSVar5[-1].entries.
                                     super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            pcVar17 = *in;
                            cVar25 = *pcVar17;
                            uVar23 = 0;
                            if (0xf5 < (byte)(cVar25 - 0x3aU)) {
                              uVar23 = 0;
                              do {
                                uVar23 = (uint)(byte)(cVar25 - 0x30) + uVar23 * 10;
                                cVar25 = pcVar17[1];
                                pcVar17 = pcVar17 + 1;
                              } while (0xf5 < (byte)(cVar25 - 0x3aU));
                            }
                            *in = pcVar17;
                            ppVar6[-1].first = uVar23;
                            for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                                pbVar18 = pbVar18 + 1) {
                            }
                            *in = (char *)pbVar18;
                            for (; (*pbVar18 == 0x20 || (*pbVar18 == 9)); pbVar18 = pbVar18 + 1) {
                            }
                            *in = (char *)pbVar18;
                            if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                              pLVar20 = DefaultLogger::get();
                              Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                            }
                            else {
                              lVar19 = 0;
                              bVar11 = true;
                              do {
                                bVar29 = bVar11;
                                for (pbVar18 = (byte *)*in; (*pbVar18 == 0x20 || (*pbVar18 == 9));
                                    pbVar18 = pbVar18 + 1) {
                                }
                                *in = (char *)pbVar18;
                                if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) {
                                  pLVar20 = DefaultLogger::get();
                                  Logger::error(pLVar20,"AC3D: Unexpected EOF/EOL");
                                }
                                else {
                                  pcVar17 = fast_atoreal_move<float>
                                                      ((char *)pbVar18,
                                                       (float *)((long)ppVar6 + lVar19 * 4 + -8),
                                                       true);
                                  *in = pcVar17;
                                }
                                lVar19 = 1;
                                bVar11 = false;
                              } while (bVar29);
                            }
                            uVar28 = uVar28 + 1;
                            this = local_38;
                          } while (uVar28 != uVar27);
                        }
                        goto LAB_003f4246;
                      }
                      pbVar31 = pbVar31 + -6;
LAB_003f4264:
                      *in = (char *)pbVar31;
                      iVar12 = local_174 + 1;
                    } while (iVar12 != (int)local_50);
                  }
                }
              }
            }
          }
LAB_003f3b13:
          bVar10 = GetNextLine(this);
        } while (bVar10);
      }
      pLVar20 = DefaultLogger::get();
      Logger::error(pLVar20,"AC3D: Unexpected EOF: \'kids\' line was expected");
    }
  }
  return;
}

Assistant:

void AC3DImporter::LoadObjectSection(std::vector<Object>& objects)
{
    if (!TokenMatch(buffer,"OBJECT",6))
        return;

    SkipSpaces(&buffer);

    ++mNumMeshes;

    objects.push_back(Object());
    Object& obj = objects.back();

    aiLight* light = NULL;
    if (!ASSIMP_strincmp(buffer,"light",5))
    {
        // This is a light source. Add it to the list
        mLights->push_back(light = new aiLight());

        // Return a point light with no attenuation
        light->mType = aiLightSource_POINT;
        light->mColorDiffuse = light->mColorSpecular = aiColor3D(1.f,1.f,1.f);
        light->mAttenuationConstant = 1.f;

        // Generate a default name for both the light source and the node
        // FIXME - what's the right way to print a size_t? Is 'zu' universally available? stick with the safe version.
        light->mName.length = ::ai_snprintf(light->mName.data, MAXLEN, "ACLight_%i",static_cast<unsigned int>(mLights->size())-1);
        obj.name = std::string( light->mName.data );

        ASSIMP_LOG_DEBUG("AC3D: Light source encountered");
        obj.type = Object::Light;
    }
    else if (!ASSIMP_strincmp(buffer,"group",5))
    {
        obj.type = Object::Group;
    }
    else if (!ASSIMP_strincmp(buffer,"world",5))
    {
        obj.type = Object::World;
    }
    else obj.type = Object::Poly;
    while (GetNextLine())
    {
        if (TokenMatch(buffer,"kids",4))
        {
            SkipSpaces(&buffer);
            unsigned int num = strtoul10(buffer,&buffer);
            GetNextLine();
            if (num)
            {
                // load the children of this object recursively
                obj.children.reserve(num);
                for (unsigned int i = 0; i < num; ++i)
                    LoadObjectSection(obj.children);
            }
            return;
        }
        else if (TokenMatch(buffer,"name",4))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.name);

            // If this is a light source, we'll also need to store
            // the name of the node in it.
            if (light)
            {
                light->mName.Set(obj.name);
            }
        }
        else if (TokenMatch(buffer,"texture",7))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.texture);
        }
        else if (TokenMatch(buffer,"texrep",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texRepeat);
            if (!obj.texRepeat.x || !obj.texRepeat.y)
                obj.texRepeat = aiVector2D (1.f,1.f);
        }
        else if (TokenMatch(buffer,"texoff",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texOffset);
        }
        else if (TokenMatch(buffer,"rot",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,9,&obj.rotation);
        }
        else if (TokenMatch(buffer,"loc",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&obj.translation);
        }
        else if (TokenMatch(buffer,"subdiv",6))
        {
            SkipSpaces(&buffer);
            obj.subDiv = strtoul10(buffer,&buffer);
        }
        else if (TokenMatch(buffer,"crease",6))
        {
            SkipSpaces(&buffer);
            obj.crease = fast_atof(buffer);
        }
        else if (TokenMatch(buffer,"numvert",7))
        {
            SkipSpaces(&buffer);

            unsigned int t = strtoul10(buffer,&buffer);
            if (t >= AI_MAX_ALLOC(aiVector3D)) {
                throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
            }
            obj.vertices.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                if (!GetNextLine())
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: not all vertices have been parsed yet");
                    break;
                }
                else if (!IsNumeric(*buffer))
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected token: not all vertices have been parsed yet");
                    --buffer; // make sure the line is processed a second time
                    break;
                }
                obj.vertices.push_back(aiVector3D());
                aiVector3D& v = obj.vertices.back();
                AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&v.x);
            }
        }
        else if (TokenMatch(buffer,"numsurf",7))
        {
            SkipSpaces(&buffer);

            bool Q3DWorkAround = false;

            const unsigned int t = strtoul10(buffer,&buffer);
            obj.surfaces.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                GetNextLine();
                if (!TokenMatch(buffer,"SURF",4))
                {
                    // FIX: this can occur for some files - Quick 3D for
                    // example writes no surf chunks
                    if (!Q3DWorkAround)
                    {
                        ASSIMP_LOG_WARN("AC3D: SURF token was expected");
                        ASSIMP_LOG_DEBUG("Continuing with Quick3D Workaround enabled");
                    }
                    --buffer; // make sure the line is processed a second time
                    // break; --- see fix notes above

                    Q3DWorkAround = true;
                }
                SkipSpaces(&buffer);
                obj.surfaces.push_back(Surface());
                Surface& surf = obj.surfaces.back();
                surf.flags = strtoul_cppstyle(buffer);

                while (1)
                {
                    if(!GetNextLine())
                    {
                        throw DeadlyImportError("AC3D: Unexpected EOF: surface is incomplete");
                    }
                    if (TokenMatch(buffer,"mat",3))
                    {
                        SkipSpaces(&buffer);
                        surf.mat = strtoul10(buffer);
                    }
                    else if (TokenMatch(buffer,"refs",4))
                    {
                        // --- see fix notes above
                        if (Q3DWorkAround)
                        {
                            if (!surf.entries.empty())
                            {
                                buffer -= 6;
                                break;
                            }
                        }

                        SkipSpaces(&buffer);
                        const unsigned int m = strtoul10(buffer);
                        surf.entries.reserve(m);

                        obj.numRefs += m;

                        for (unsigned int k = 0; k < m; ++k)
                        {
                            if(!GetNextLine())
                            {
                                ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: surface references are incomplete");
                                break;
                            }
                            surf.entries.push_back(Surface::SurfaceEntry());
                            Surface::SurfaceEntry& entry = surf.entries.back();

                            entry.first = strtoul10(buffer,&buffer);
                            SkipSpaces(&buffer);
                            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&entry.second);
                        }
                    }
                    else
                    {

                        --buffer; // make sure the line is processed a second time
                        break;
                    }
                }
            }
        }
    }
    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: \'kids\' line was expected");
}